

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O1

UEnumeration * uloc_openKeywords_63(char *localeID,UErrorCode *status)

{
  char prev;
  int32_t iVar1;
  char *pcVar2;
  UEnumeration *pUVar3;
  char *tmpLocaleID;
  char keywords [256];
  char tempBuffer [157];
  char *local_1c0;
  char *local_1b8 [32];
  char local_b8 [160];
  
  if (status == (UErrorCode *)0x0) {
    return (UEnumeration *)0x0;
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (localeID == (char *)0x0) {
      local_1c0 = locale_get_default_63();
    }
    else {
      pcVar2 = strchr(localeID,0x40);
      local_1c0 = localeID;
      if ((pcVar2 == (char *)0x0) &&
         (iVar1 = getShortestSubtagLength(localeID), local_1c0 = localeID, iVar1 == 1)) {
        iVar1 = uloc_forLanguageTag_63(localeID,local_b8,0x9d,(int32_t *)0x0,status);
        if (((iVar1 < 1) ||
            (local_1c0 = local_b8,
            U_ZERO_ERROR < *status || *status == U_STRING_NOT_TERMINATED_WARNING)) &&
           (local_1c0 = localeID, *status == U_STRING_NOT_TERMINATED_WARNING)) {
          *status = U_BUFFER_OVERFLOW_ERROR;
          local_1c0 = localeID;
        }
      }
    }
    ulocimp_getLanguage_63(local_1c0,(char *)0x0,0,&local_1c0);
    if ((*local_1c0 == '_') || (*local_1c0 == '-')) {
      ulocimp_getScript_63(local_1c0 + 1,(char *)0x0,0,local_1b8);
      if (local_1b8[0] != local_1c0 + 1) {
        local_1c0 = local_1b8[0];
      }
      if ((*local_1c0 == '_') || (*local_1c0 == '-')) {
        ulocimp_getCountry_63(local_1c0 + 1,(char *)0x0,0,&local_1c0);
        prev = *local_1c0;
        if ((prev == '_') || (prev == '-')) {
          _getVariantEx(local_1c0 + 1,prev,(char *)0x0,0,'\0');
        }
      }
    }
    local_1c0 = strchr(local_1c0,0x40);
    if (local_1c0 == (char *)0x0) {
      iVar1 = 0;
    }
    else {
      iVar1 = _getKeywords(local_1c0 + 1,'@',(char *)local_1b8,0x100,(char *)0x0,0,(int32_t *)0x0,
                           '\0',(char *)0x0,(char *)0x0,status);
    }
    if (iVar1 != 0) {
      pUVar3 = uloc_openKeywordList_63((char *)local_1b8,iVar1,status);
      return pUVar3;
    }
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration* U_EXPORT2
uloc_openKeywords(const char* localeID,
                        UErrorCode* status)
{
    int32_t i=0;
    char keywords[256];
    int32_t keywordsCapacity = 256;
    char tempBuffer[ULOC_FULLNAME_CAPACITY];
    const char* tmpLocaleID;

    if(status==NULL || U_FAILURE(*status)) {
        return 0;
    }

    if (_hasBCP47Extension(localeID)) {
        _ConvertBCP47(tmpLocaleID, localeID, tempBuffer, sizeof(tempBuffer), status);
    } else {
        if (localeID==NULL) {
           localeID=uloc_getDefault();
        }
        tmpLocaleID=localeID;
    }

    /* Skip the language */
    ulocimp_getLanguage(tmpLocaleID, NULL, 0, &tmpLocaleID);
    if(_isIDSeparator(*tmpLocaleID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(tmpLocaleID+1, NULL, 0, &scriptID);
        if(scriptID != tmpLocaleID+1) {
            /* Found optional script */
            tmpLocaleID = scriptID;
        }
        /* Skip the Country */
        if (_isIDSeparator(*tmpLocaleID)) {
            ulocimp_getCountry(tmpLocaleID+1, NULL, 0, &tmpLocaleID);
            if(_isIDSeparator(*tmpLocaleID)) {
                _getVariant(tmpLocaleID+1, *tmpLocaleID, NULL, 0);
            }
        }
    }

    /* keywords are located after '@' */
    if((tmpLocaleID = locale_getKeywordsStart(tmpLocaleID)) != NULL) {
        i=locale_getKeywords(tmpLocaleID+1, '@', keywords, keywordsCapacity, NULL, 0, NULL, FALSE, status);
    }

    if(i) {
        return uloc_openKeywordList(keywords, i, status);
    } else {
        return NULL;
    }
}